

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect_common(Curl_cfilter *cf,Curl_easy *data,_Bool nonblocking,_Bool *done)

{
  void *pvVar1;
  curl_socket_t cVar2;
  int iVar3;
  CURLcode CVar4;
  timediff_t tVar5;
  uint *puVar6;
  curl_socket_t local_68;
  curl_socket_t local_64;
  curl_socket_t readfd;
  curl_socket_t writefd;
  timediff_t timeout_ms_1;
  timediff_t timeout_ms;
  int what;
  curl_socket_t sockfd;
  ssl_connect_data *connssl;
  CURLcode result;
  _Bool *done_local;
  _Bool nonblocking_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  connssl._4_4_ = CURLE_OK;
  pvVar1 = cf->ctx;
  cVar2 = Curl_conn_cf_get_socket(cf,data);
  *(undefined4 *)((long)pvVar1 + 0x58) = 0;
  if (*(int *)((long)pvVar1 + 0x50) == 2) {
    *done = true;
    return CURLE_OK;
  }
  if (*(int *)((long)pvVar1 + 0x54) == 0) {
    tVar5 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar5 < 0) {
      Curl_failf(data,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    connssl._4_4_ = ossl_connect_step1(cf,data);
    if (connssl._4_4_ != CURLE_OK) {
      return connssl._4_4_;
    }
  }
  do {
    if (*(int *)((long)pvVar1 + 0x54) != 1) {
      if ((*(int *)((long)pvVar1 + 0x54) != 2) ||
         (connssl._4_4_ = ossl_connect_step3(cf,data), connssl._4_4_ == CURLE_OK)) {
        if (*(int *)((long)pvVar1 + 0x54) == 3) {
          *(undefined4 *)((long)pvVar1 + 0x50) = 2;
          *done = true;
        }
        else {
          *done = false;
        }
        *(undefined4 *)((long)pvVar1 + 0x54) = 0;
      }
      return connssl._4_4_;
    }
    tVar5 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar5 < 0) {
      Curl_failf(data,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    if ((!nonblocking) && (*(int *)((long)pvVar1 + 0x58) != 0)) {
      local_64 = cVar2;
      if ((*(uint *)((long)pvVar1 + 0x58) & 2) == 0) {
        local_64 = -1;
      }
      local_68 = cVar2;
      if ((*(uint *)((long)pvVar1 + 0x58) & 1) == 0) {
        local_68 = -1;
      }
      iVar3 = Curl_socket_check(local_68,-1,local_64,tVar5);
      if (iVar3 < 0) {
        puVar6 = (uint *)__errno_location();
        Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar6);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar3 == 0) {
        Curl_failf(data,"SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    CVar4 = ossl_connect_step2(cf,data);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    connssl._4_4_ = CURLE_OK;
  } while ((!nonblocking) || (*(int *)((long)pvVar1 + 0x54) != 1));
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;
  curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
  int what;

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we are allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  while(ssl_connect_2 == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }

    /* if ssl is expecting something, check if it is available. */
    if(!nonblocking && connssl->io_need) {

      curl_socket_t writefd = (connssl->io_need & CURL_SSL_IO_NEED_SEND)?
                              sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = (connssl->io_need & CURL_SSL_IO_NEED_RECV)?
                             sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        result = CURLE_SSL_CONNECT_ERROR;
        goto out;
      }
      if(0 == what) {
        /* timeout */
        failf(data, "SSL connection timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(cf, data);
    if(result || (nonblocking && (ssl_connect_2 == connssl->connecting_state)))
      goto out;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

out:
  return result;
}